

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O1

ExchangeAbsolutePositionRequests __thiscall
adios2::aggregator::MPIChain::IExchangeAbsolutePosition(MPIChain *this,Buffer *buffer,int step)

{
  size_t *this_00;
  uint tag;
  char cVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_RCX;
  size_type *psVar7;
  undefined4 in_register_00000014;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_00;
  ulong uVar8;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_01;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_02;
  _Head_base<0UL,_adios2::helper::CommReqImpl_*,_false> _Var9;
  _Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_03;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_04;
  CommReqImpl *extraout_RDX_05;
  CommReqImpl *extraout_RDX_06;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ExchangeAbsolutePositionRequests EVar13;
  string __str;
  string local_b8;
  string local_98;
  string local_78;
  size_t *local_58;
  string local_50;
  
  lVar2 = CONCAT44(in_register_00000014,step);
  if (*(int *)((long)&buffer->m_FixedSize + 4) == 1) {
    helper::Comm::Req::Req((Req *)this);
    helper::Comm::Req::Req((Req *)&(this->super_MPIAggregator).m_SubStreams);
    _Var9._M_head_impl =
         (CommReqImpl *)
         extraout_RDX._M_t.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    goto LAB_00652351;
  }
  if ((char)buffer[1].m_Type._M_string_length == '\x01') {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Toolkit","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"aggregator::mpi::MPIChain","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"IExchangeAbsolutePosition","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"An existing exchange is still active","");
    helper::Throw<std::runtime_error>(&local_78,&local_98,&local_b8,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  tag = (uint)in_RCX;
  uVar10 = 0;
  if (*(int *)((long)&buffer->m_FixedSize + 4) - 1U != tag) {
    uVar10 = tag + 1;
  }
  helper::Comm::Req::Req((Req *)this);
  this_00 = &(this->super_MPIAggregator).m_SubStreams;
  helper::Comm::Req::Req((Req *)this_00);
  if (tag == 0) {
    buffer[1].m_Type.field_2._M_allocated_capacity =
         *(size_type *)(lVar2 + 0x30 + (ulong)((int)buffer->m_FixedSize == 0) * 8);
  }
  uVar11 = (uint)buffer->m_FixedSize;
  cVar1 = (char)((ulong)in_RCX >> 0x18) >> 7;
  local_58 = this_00;
  if (uVar11 == tag) {
    if (uVar11 == 0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(lVar2 + 0x38);
    }
    *(size_type *)((long)&buffer[1].m_Type.field_2 + 8) =
         lVar2 + buffer[1].m_Type.field_2._M_allocated_capacity;
    uVar11 = -tag;
    if (0 < (int)tag) {
      uVar11 = tag;
    }
    uVar12 = 1;
    if (9 < uVar11) {
      uVar8 = (ulong)uVar11;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_006521e6;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_006521e6;
        }
        if (uVar6 < 10000) goto LAB_006521e6;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_006521e6:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar12 - cVar1);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_b8._M_dataplus._M_p + (tag >> 0x1f),uVar12,uVar11);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x75f24c);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98.field_2._8_8_ = plVar3[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_98._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_78.field_2._M_allocated_capacity = *psVar7;
      local_78.field_2._8_8_ = plVar3[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar7;
      local_78._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_78._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    helper::Comm::Isend<unsigned_long>
              ((Comm *)&local_50,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
               (size_t)((long)&buffer[1].m_Type.field_2 + 8),1,uVar10,(string *)0x0);
    helper::Comm::Req::operator=((Req *)this,(Req *)&local_50);
    helper::Comm::Req::~Req((Req *)&local_50);
    _Var9._M_head_impl =
         (CommReqImpl *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var9._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_02.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_00652333:
      operator_delete(local_98._M_dataplus._M_p);
      _Var9._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_03.super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
LAB_00652338:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
      _Var9._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_04.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
  }
  else {
    _Var9._M_head_impl =
         (CommReqImpl *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    if (uVar11 == uVar10) {
      uVar10 = -tag;
      if (0 < (int)tag) {
        uVar10 = tag;
      }
      uVar11 = 1;
      if (9 < uVar10) {
        uVar8 = (ulong)uVar10;
        uVar12 = 4;
        do {
          uVar11 = uVar12;
          uVar5 = (uint)uVar8;
          if (uVar5 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_0065236f;
          }
          if (uVar5 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_0065236f;
          }
          if (uVar5 < 10000) goto LAB_0065236f;
          uVar8 = uVar8 / 10000;
          uVar12 = uVar11 + 4;
        } while (99999 < uVar5);
        uVar11 = uVar11 + 1;
      }
LAB_0065236f:
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar11 - cVar1);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_b8._M_dataplus._M_p + (tag >> 0x1f),uVar11,uVar10);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x75f280);
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98.field_2._8_8_ = puVar4[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_98._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_78.field_2._M_allocated_capacity = *psVar7;
        local_78.field_2._8_8_ = puVar4[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar7;
        local_78._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_78._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      helper::Comm::Irecv<unsigned_long>
                ((Comm *)&local_50,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
                 lVar2 + 0x38,1,tag,(string *)0x0);
      helper::Comm::Req::operator=((Req *)local_58,(Req *)&local_50);
      helper::Comm::Req::~Req((Req *)&local_50);
      _Var9._M_head_impl = extraout_RDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        _Var9._M_head_impl = extraout_RDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_00652333;
      goto LAB_00652338;
    }
  }
  *(undefined1 *)&buffer[1].m_Type._M_string_length = 1;
LAB_00652351:
  EVar13.m_Recv.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       _Var9._M_head_impl;
  EVar13.m_Send.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       this;
  return EVar13;
}

Assistant:

MPIChain::ExchangeAbsolutePositionRequests
MPIChain::IExchangeAbsolutePosition(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    if (m_IsInExchangeAbsolutePosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "aggregator::mpi::MPIChain",
                                          "IExchangeAbsolutePosition",
                                          "An existing exchange is still active");
    }

    const int destination = (step != m_Size - 1) ? step + 1 : 0;
    ExchangeAbsolutePositionRequests requests;

    if (step == 0)
    {
        m_SizeSend = (m_Rank == 0) ? buffer.m_AbsolutePosition : buffer.m_Position;
    }

    if (m_Rank == step)
    {
        m_ExchangeAbsolutePosition =
            (m_Rank == 0) ? m_SizeSend : m_SizeSend + buffer.m_AbsolutePosition;

        requests.m_Send = m_Comm.Isend(&m_ExchangeAbsolutePosition, 1, destination, 0,
                                       ", aggregation Isend absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }
    else if (m_Rank == destination)
    {
        requests.m_Recv = m_Comm.Irecv(&buffer.m_AbsolutePosition, 1, step, 0,
                                       ", aggregation Irecv absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }

    m_IsInExchangeAbsolutePosition = true;
    return requests;
}